

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
::EqualElement<char[11]>::operator()
          (void *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  __type _Var1;
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,*this,&local_31);
  _Var1 = std::operator==(lhs,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return _Var1;
}

Assistant:

bool operator()(const K2& lhs, Args&&...) const
				{
					return eq(lhs, rhs);
				}